

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_map_int64_Test::TestBody(Btree_map_int64_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  PVar5;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  PVar6;
  field_type fVar7;
  bool bVar8;
  byte bVar9;
  pointer p;
  pointer p_00;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  this_00;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  *pbVar10;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  *this_01;
  slot_type *args;
  btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_> *pbVar11;
  mapped_type *pmVar12;
  pointer ppVar13;
  pointer ppVar14;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values_00;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values_01;
  const_pointer hint;
  const_pointer hint_00;
  ulong extraout_RDX;
  size_type n;
  size_type n_00;
  mapped_type mVar15;
  int i_3;
  uint uVar16;
  int i;
  int iVar17;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  *b;
  size_type i_00;
  int in_R8D;
  char *pcVar18;
  uint uVar19;
  undefined1 *this_02;
  const_iterator cVar20;
  iterator iVar21;
  iterator iVar22;
  iterator iVar23;
  AssertHelper local_118;
  pair<const_long,_long> local_110;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> sorted_values;
  int64_t bytes1;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> random_values;
  int64_t original_bytes1;
  Generator<std::pair<const_long,_long>_> generator;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  container;
  int64_t bytes2;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator1;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>>
            ();
  GenerateValuesWithSeed<std::pair<long,long>>
            (&random_values,(priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)&container;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &container.
        super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
        .checker_._M_t._M_impl.super__Rb_tree_header._M_header;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       container.
       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&sorted_values,&random_values);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sorted_values.
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             CONCAT44(sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)sorted_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish));
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&container,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)&sorted_values,values);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>
            (sorted_values.
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             CONCAT44(sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)sorted_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish));
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&container,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)&sorted_values,values_00);
  b = (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       *)&random_values;
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&container,b,values_01);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>);
  base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  ::~base_checker(&container.
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 );
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>);
  bytes1 = 0;
  bytes2 = 0;
  generator.tgen.maxval = 1000;
  generator.ugen.maxval = 1000;
  allocator2.
  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                  )(CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                    )&bytes2;
  allocator1.
  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                  )(CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                    )&bytes1;
  p = CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
      ::allocate(&allocator1.
                  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                 ,(size_type)b,hint);
  p_00 = CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
         ::allocate(&allocator2.
                     super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                    ,(size_type)b,hint_00);
  this_02 = btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
            ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)0x0;
  random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&bytes2;
  random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                ::EmptyNode()::empty_node;
  random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                ::EmptyNode()::empty_node;
  original_bytes1 = bytes1;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)&bytes1;
  local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)&sorted_values,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&container,&local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar18);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((long *)local_110.first != (long *)0x0) {
      (**(code **)(*(long *)local_110.first + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
           *)&container);
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)&bytes2;
  if (container.
      super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
      .const_tree_ !=
      (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)0x0
     ) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x9a5,
                  "void phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>::copy_or_move_values_in_order(Btree *) [Params = phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>, Btree = const phmap::priv::btree<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>]"
                 );
  }
  cVar20 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                  *)&random_values);
  if (cVar20.node ==
      (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
       *)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node && cVar20.position == 0) {
    pbVar11 = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               *)0x0;
LAB_00136925:
    local_110.first = (long)pbVar11;
    local_118.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
               (int *)&local_118);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c2,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_110.second;
    local_110 = (pair<const_long,_long>)(auVar2 << 0x40);
    local_118.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&sorted_values,"b2.size()","0",(unsigned_long *)&local_110,
               (int *)&local_118);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c3,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c4,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar17 = 1; iVar17 != 1000; iVar17 = iVar17 + 1) {
      local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,iVar17);
      btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
      ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
                *)&sorted_values,
               (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
                *)&container,&local_110);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2cb,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&random_values);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&container);
    PVar6 = allocator1;
    PVar5 = allocator2;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         allocator1.
         super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)0x0;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)allocator2.
                  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                  .bytes_used_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                  ::EmptyNode()::empty_node;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                  ::EmptyNode()::empty_node;
    original_bytes1 = bytes1;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,0);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)&sorted_values,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&container,&local_110);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2d5,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&container);
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.size_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.rightmost_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.root_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar5.
         super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)0x0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_110.second;
    local_110 = (pair<const_long,_long>)(auVar3 << 0x40);
    local_118.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
               (int *)&local_118);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2d9,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2da,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar17 = 1; iVar17 != 1000; iVar17 = iVar17 + 1) {
      local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,iVar17);
      btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
      ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
                *)&sorted_values,
               (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
                *)&container,&local_110);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2e1,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&random_values);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&container);
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar6.
         super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)0x0;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)PVar5.
                  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                  .bytes_used_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                  ::EmptyNode()::empty_node;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                  ::EmptyNode()::empty_node;
    original_bytes1 = bytes1;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,0);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)&sorted_values,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&container,&local_110);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2eb,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    pbVar11 = container.
              super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              .const_tree_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.size_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.rightmost_;
    random_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.root_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar5.
         super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .const_tree_ = (btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)0x0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_110.second;
    local_110 = (pair<const_long,_long>)(auVar4 << 0x40);
    local_118.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
               (int *)&local_118);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2ef,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    local_110.first = (long)pbVar11;
    local_118.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&sorted_values,"b2.size()","1",(unsigned_long *)&local_110,
               (int *)&local_118);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f0,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f1,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar17 = 1; iVar17 != 1000; iVar17 = iVar17 + 1) {
      local_110 = Generator<std::pair<const_long,_long>_>::operator()(&generator,iVar17);
      btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
      ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
                *)&sorted_values,
               (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
                *)&container,&local_110);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
    if ((char)sorted_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_110);
      if ((undefined8 *)
          CONCAT44(sorted_values.
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)sorted_values.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(sorted_values.
                                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)sorted_values.
                                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f8,pcVar18);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)local_110.first != (long *)0x0) {
        (**(code **)(*(long *)local_110.first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&random_values);
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             *)&container);
    CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
    ::deallocate(&allocator1.
                  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                 ,p,n);
    CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
    ::deallocate(&allocator2.
                  super_CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                 ,p_00,n_00);
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )((ulong)container.
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   .tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                   ._M_head_impl & 0xffffffff00000000);
    Generator<long>::operator()((Generator<long> *)&container,0);
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.size_ = 0;
    for (iVar17 = 0; iVar17 != 1000; iVar17 = iVar17 + 1) {
      sorted_values.
      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3e8000003e8;
      random_values.
      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           Generator<std::pair<const_long,_long>_>::operator()
                     ((Generator<std::pair<const_long,_long>_> *)&sorted_values,iVar17);
      mVar15 = random_values.
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pmVar12 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                ::operator[]((btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                              *)&container,(key_type *)&random_values);
      *pmVar12 = mVar15;
    }
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)container.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  .tree_.
                  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                  .tree_.size_;
    local_110.first._0_4_ = 1000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&random_values,"b.size()","1000",(unsigned_long *)&sorted_values,
               (int *)&local_110);
    if ((char)random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&sorted_values);
      if (random_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = (char *)(random_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x30e,pcVar18);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&sorted_values);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (sorted_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&random_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    iVar23 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&container);
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar23.node;
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23.position;
    ppVar13 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
              ::operator->((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&sorted_values);
    bytes1 = 0x3e8000003e8;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)&bytes1,0);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&random_values,"b.begin()->first","Generator<value_type>(1000)(0).first",
               &ppVar13->first,&local_110.first);
    if ((char)random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&sorted_values);
      if (random_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = (char *)(random_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x313,pcVar18);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&sorted_values);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (sorted_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&random_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    iVar23 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&container);
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar23.node;
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23.position;
    ppVar13 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
              ::operator->((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&sorted_values);
    bytes1 = 0x3e8000003e8;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)&bytes1,0);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&random_values,"b.begin()->second",
               "Generator<value_type>(1000)(0).second",&ppVar13->second,&local_110.second);
    if ((char)random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&sorted_values);
      if (random_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = (char *)(random_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x314,pcVar18);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&sorted_values);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (sorted_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&random_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    iVar23 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&container);
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar23.node;
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23.position;
    ppVar14 = std::
              reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
              ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                            *)&sorted_values);
    bytes1 = 0x3e8000003e8;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)&bytes1,999);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&random_values,"b.rbegin()->first",
               "Generator<value_type>(1000)(999).first",&ppVar14->first,&local_110.first);
    if ((char)random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&sorted_values);
      if (random_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = (char *)(random_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x315,pcVar18);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&sorted_values);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (sorted_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&random_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    iVar23 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&container);
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar23.node;
    sorted_values.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23.position;
    ppVar14 = std::
              reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
              ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                            *)&sorted_values);
    bytes1 = 0x3e8000003e8;
    local_110 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)&bytes1,999);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&random_values,"b.rbegin()->second",
               "Generator<value_type>(1000)(999).second",&ppVar14->second,&local_110.second);
    if ((char)random_values.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&sorted_values);
      if (random_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = (char *)(random_values.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x316,pcVar18);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_110,(Message *)&sorted_values);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (sorted_values.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((sorted_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&random_values.
                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
    ::~btree((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              *)&container);
    return;
  }
  this_00._M_head_impl =
       (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
        *)btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
          ::new_leaf_root_node
                    ((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&container,1);
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        )(_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
          )this_00._M_head_impl;
  container.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)this_00._M_head_impl;
  while( true ) {
    fVar7 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
            ::count((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                     *)this_00._M_head_impl);
    if (fVar7 != '\0') {
      btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
      ::slot((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
              *)this_00._M_head_impl,0);
    }
    bVar8 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    *)this_00._M_head_impl);
    if (bVar8) break;
    this_00._M_head_impl =
         (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
          *)btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
            ::child(this_00._M_head_impl,0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = extraout_RDX;
  iVar21 = btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
           ::
           internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>,std::pair<long_const,long>&,std::pair<long_const,long>*>>
                     ((btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                       *)this_00._M_head_impl,
                      (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                       )(auVar1 << 0x40));
  if (iVar21.node ==
      (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
       *)0x0) {
    iVar21 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&container);
  }
  btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
  ::internal_emplace<std::pair<long_const,long>const&>
            ((btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
              *)&container,iVar21,
             (pair<const_long,_long> *)
             &testing::internal::
              TestFactoryImpl<phmap::priv::(anonymous_namespace)::Btree_map_string_Test>::vtable);
  uVar19 = 0;
  do {
    bVar8 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    *)this_02);
    if (bVar8) {
      uVar19 = uVar19 + 1;
      bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                       *)this_02);
      if ((int)(uint)bVar9 <= (int)uVar19) goto LAB_0013680c;
    }
    else {
LAB_0013680c:
      bVar8 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
              ::leaf((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_02);
      bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                       *)this_02);
      if (bVar8) {
        this_01 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                   *)this_02;
        uVar16 = uVar19;
        if ((int)uVar19 < (int)(uint)bVar9) {
          __assert_fail("position >= node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x972,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, const std::pair<const long, long> &, const std::pair<const long, long> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, Reference = const std::pair<const long, long> &, Pointer = const std::pair<const long, long> *]"
                       );
        }
        while ((bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                        ::count(this_01), uVar16 == bVar9 &&
               (bVar8 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                        ::is_root(this_01), !bVar8))) {
          pbVar10 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    ::parent(this_01);
          bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                  ::position(this_01);
          pbVar10 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    ::child(pbVar10,(ulong)bVar9);
          if (pbVar10 != this_01) {
            __assert_fail("node->parent()->child(node->position()) == node",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x975,
                          "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, const std::pair<const long, long> &, const std::pair<const long, long> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, Reference = const std::pair<const long, long> &, Pointer = const std::pair<const long, long> *]"
                         );
          }
          bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                  ::position(this_01);
          uVar16 = (uint)bVar9;
          this_01 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    ::parent(this_01);
        }
        bVar9 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                ::count(this_01);
        if (uVar16 != bVar9) {
          this_02 = this_01;
          uVar19 = uVar16;
        }
      }
      else {
        if ((int)(uint)bVar9 <= (int)uVar19) {
          __assert_fail("position < node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x97d,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, const std::pair<const long, long> &, const std::pair<const long, long> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>>, Reference = const std::pair<const long, long> &, Pointer = const std::pair<const long, long> *]"
                       );
        }
        i_00 = (size_type)(int)(uVar19 + 1);
        while( true ) {
          this_02 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    ::child((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                             *)this_02,i_00);
          bVar8 = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                  ::leaf((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                          *)this_02);
          if (bVar8) break;
          i_00 = 0;
        }
        uVar19 = 0;
      }
    }
    cVar20 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&random_values);
    pbVar11 = container.
              super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              .const_tree_;
    if (uVar19 == cVar20.position &&
        (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
         *)this_02 == cVar20.node) goto LAB_00136925;
    iVar22 = btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&container);
    args = btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
           ::slot((btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                   *)this_02,(long)(int)uVar19);
    iVar21._12_4_ = 0;
    iVar21.node = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                   *)SUB128(iVar22._0_12_,0);
    iVar21.position = SUB124(iVar22._0_12_,8);
    btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
    ::internal_emplace<std::pair<long_const,long>const&>
              ((btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
                *)&container,iVar21,&args->value);
  } while( true );
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }